

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

QPointF anon_unknown.dwarf_d603ce::intersectLine<((anonymous_namespace)::Edge)0>
                  (QPointF *a,QPointF *b,qreal t)

{
  QPointF *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar1;
  QLineF line;
  QLineF *in_stack_ffffffffffffffc8;
  QLineF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.pt2.xp = -NAN;
  local_28.pt2.yp = -NAN;
  local_28.pt1.xp = -NAN;
  local_28.pt1.yp = -NAN;
  QLineF::QLineF(&local_28,in_RDI,in_RSI);
  QPointF::x(in_RDI);
  QPointF::x(in_RSI);
  QPointF::x(in_RDI);
  QVar1 = QLineF::pointAt(in_stack_ffffffffffffffc8,(qreal)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPointF intersectLine(const QPointF &a, const QPointF &b, qreal t)
{
    QLineF line(a, b);
    switch (edge) {
    case Left:
    case Right:
        return line.pointAt((t - a.x()) / (b.x() - a.x()));
    default:
        return line.pointAt((t - a.y()) / (b.y() - a.y()));
    }
}